

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
mxx::impl::
distribute_container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::stable_distribute(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c,comm *comm)

{
  int iVar1;
  pointer pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  size_t local_size;
  custom_op<unsigned_long,_true> op;
  size_type local_78;
  ulong local_70;
  custom_op<unsigned_long,_true> local_68;
  
  iVar1 = comm->m_size;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar1 == 1) {
    pcVar2 = (c->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + c->_M_string_length);
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_78 = c->_M_string_length;
    custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
              ((custom_op<unsigned_long,true> *)&local_68);
    MPI_Allreduce(&local_78,&local_70,1,local_68.m_type_copy,local_68.m_op,comm->mpi_comm);
    custom_op<unsigned_long,_true>::~custom_op(&local_68);
    std::__cxx11::string::resize
              ((ulong)__return_storage_ptr__,
               (char)(local_70 / (ulong)(long)comm->m_size) +
               ((ulong)(long)comm->m_rank < local_70 % (ulong)(long)comm->m_size));
    begin._M_current = (c->_M_dataplus)._M_p;
    stable_distribute<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (begin,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(begin._M_current + c->_M_string_length),
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(__return_storage_ptr__->_M_dataplus)._M_p,comm);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static Container stable_distribute(const Container& c, const mxx::comm& comm) {
        if (comm.size() == 1)
            return c;
        Container result;
        size_t local_size = c.size();
        // TODO: this allreduce is duplicated in the `stable_distribute` function
        //       which could be avoided
        size_t total_size = mxx::allreduce(local_size, comm);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        result.resize(part.local_size());

        // call the iterator based implementation
        ::mxx::stable_distribute(c.begin(), c.end(), result.begin(), comm);

        // return the container
        return result;
    }